

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Klex.cpp
# Opt level: O0

string * __thiscall
Klex::parseOutString_abi_cxx11_(string *__return_storage_ptr__,Klex *this,char quote)

{
  int iVar1;
  char cVar2;
  bool bVar3;
  char quote_local;
  Klex *this_local;
  string *lexeme;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  while( true ) {
    iVar1 = getChar(this);
    bVar3 = false;
    if (iVar1 != -1) {
      iVar1 = getChar(this);
      bVar3 = iVar1 != quote;
    }
    if (!bVar3) break;
    iVar1 = getChar(this);
    cVar2 = (char)__return_storage_ptr__;
    if (iVar1 == 0x5c) {
      nextChar(this);
      iVar1 = getChar(this);
      if (iVar1 == 0x6e) {
        std::__cxx11::string::push_back(cVar2);
      }
      else {
        iVar1 = getChar(this);
        if (iVar1 == 0x74) {
          std::__cxx11::string::push_back(cVar2);
        }
        else {
          std::__cxx11::string::push_back(cVar2);
          getChar(this);
          std::__cxx11::string::push_back(cVar2);
        }
      }
    }
    else {
      getChar(this);
      std::__cxx11::string::push_back(cVar2);
    }
    nextChar(this);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Klex::parseOutString(char quote) {
    std::string lexeme;

    while(getChar() != EOF && getChar() != quote) {
        if(getChar() == '\\') {
            nextChar();
            if(getChar() == 'n') {
                lexeme.push_back('\n');
            } else if(getChar() == 't') {
                lexeme.push_back('\t');
            } else {
                lexeme.push_back('\\');
                lexeme.push_back(getChar());
            }
        } else {
            lexeme.push_back(getChar());
        }
        nextChar();
    }

    return lexeme;
}